

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

void QtPrivate::QDebugStreamOperatorForType<QPointF,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  long in_FS_OFFSET;
  QPointF local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.xp = (qreal)dbg->stream;
  ((Stream *)local_20.xp)->ref = ((Stream *)local_20.xp)->ref + 1;
  ::operator<<((QDebug)&local_20.yp,&local_20);
  QDebug::~QDebug((QDebug *)&local_20.yp);
  QDebug::~QDebug((QDebug *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }